

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEES_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::SEES_PDU::SEES_PDU
          (SEES_PDU *this,EntityIdentifier *OriginatingEnt,KUINT16 IrSigIndex,
          KUINT16 AcousticSigIndex,KUINT16 RadarCrossSectionSigIndex)

{
  KUINT16 KVar1;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__SEES_PDU_00222710;
  (this->m_OriginatingEntity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_0021fd78;
  KVar1 = (OriginatingEnt->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_OriginatingEntity).super_SimulationIdentifier.m_ui16SiteID =
       (OriginatingEnt->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_OriginatingEntity).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_OriginatingEntity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_0021fd20;
  *(undefined2 *)&(this->m_OriginatingEntity).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(OriginatingEnt->super_SimulationIdentifier).field_0xc;
  this->m_ui16IrSigRepIndex = IrSigIndex;
  this->m_ui16AcousticSigRepIndex = AcousticSigIndex;
  this->m_ui16CrossSection = RadarCrossSectionSigIndex;
  this->m_ui16NumPropulsionSys = 0;
  this->m_ui16NumVectoringNozzleSys = 0;
  (this->m_vPropSys).
  super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vPropSys).
  super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vPropSys).
  super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vVecNozzleSys).
  super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vVecNozzleSys).
  super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vVecNozzleSys).
  super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8PDUType = '\x1e';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x06';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x1c;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

SEES_PDU::SEES_PDU( const EntityIdentifier & OriginatingEnt, KUINT16 IrSigIndex, KUINT16 AcousticSigIndex,
                    KUINT16 RadarCrossSectionSigIndex ) :
    m_OriginatingEntity( OriginatingEnt ),
    m_ui16IrSigRepIndex( IrSigIndex ),
    m_ui16AcousticSigRepIndex( AcousticSigIndex ),
    m_ui16CrossSection( RadarCrossSectionSigIndex ),
    m_ui16NumPropulsionSys( 0 ),
    m_ui16NumVectoringNozzleSys( 0 )
{
    m_ui8ProtocolFamily = Distributed_Emission_Regeneration;
    m_ui8PDUType = SupplementalEmission_EntityState_PDU_Type;
    m_ui16PDULength = SEES_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}